

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManCollectObjs_rec(Gia_Man_t *p,int iObjId,Vec_Int_t *vObjs,int Limit)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int Limit_local;
  Vec_Int_t *vObjs_local;
  int iObjId_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vObjs);
  if (iVar1 == Limit) {
    return;
  }
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObjId);
  if (iVar1 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrentId(p,iObjId);
  pObj_00 = Gia_ManObj(p,iObjId);
  iVar1 = Gia_ObjIsAnd(pObj_00);
  if (iVar1 != 0) {
    iVar1 = Gia_ObjFaninId0p(p,pObj_00);
    Gia_ManCollectObjs_rec(p,iVar1,vObjs,Limit);
    iVar1 = Vec_IntSize(vObjs);
    if (iVar1 == Limit) {
      return;
    }
    iVar1 = Gia_ObjFaninId1p(p,pObj_00);
    Gia_ManCollectObjs_rec(p,iVar1,vObjs,Limit);
    iVar1 = Vec_IntSize(vObjs);
    if (iVar1 == Limit) {
      return;
    }
  }
  Vec_IntPush(vObjs,iObjId);
  return;
}

Assistant:

void Gia_ManCollectObjs_rec( Gia_Man_t * p, int iObjId, Vec_Int_t * vObjs, int Limit )
{
    Gia_Obj_t * pObj;
    if ( Vec_IntSize(vObjs) == Limit )
        return;
    if ( Gia_ObjIsTravIdCurrentId(p, iObjId) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObjId);
    pObj = Gia_ManObj( p, iObjId );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCollectObjs_rec( p, Gia_ObjFaninId0p(p, pObj), vObjs, Limit );
        if ( Vec_IntSize(vObjs) == Limit )
            return;
        Gia_ManCollectObjs_rec( p, Gia_ObjFaninId1p(p, pObj), vObjs, Limit );
        if ( Vec_IntSize(vObjs) == Limit )
            return;
    }
    Vec_IntPush( vObjs, iObjId );
}